

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

reference __thiscall
immutable::vector_iterator<int,_true,_5>::operator*(vector_iterator<int,_true,_5> *this)

{
  uint uVar1;
  size_type_conflict sVar2;
  __tuple_element_t<0UL,_tuple<const_int_*,_unsigned_int,_unsigned_int>_> piVar3;
  __tuple_element_t<1UL,_tuple<const_int_*,_unsigned_int,_unsigned_int>_> *p_Var4;
  __tuple_element_t<2UL,_tuple<const_int_*,_unsigned_int,_unsigned_int>_> *p_Var5;
  __tuple_element_t<0UL,_tuple<const_int_*,_unsigned_int,_unsigned_int>_> *ppiVar6;
  tuple<const_int_*,_unsigned_int,_unsigned_int> local_20;
  vector_iterator<int,_true,_5> *local_10;
  vector_iterator<int,_true,_5> *this_local;
  
  uVar1 = this->_index;
  local_10 = this;
  p_Var4 = std::get<1ul,int_const*,unsigned_int,unsigned_int>(&this->_cursor);
  if (*p_Var4 <= uVar1) {
    uVar1 = this->_index;
    p_Var5 = std::get<2ul,int_const*,unsigned_int,unsigned_int>(&this->_cursor);
    if (uVar1 < *p_Var5) goto LAB_0015895b;
  }
  rrb_region_for<int,true,5>((immutable *)&local_20,&this->_impl,this->_index);
  std::tuple<const_int_*,_unsigned_int,_unsigned_int>::operator=(&this->_cursor,&local_20);
LAB_0015895b:
  ppiVar6 = std::get<0ul,int_const*,unsigned_int,unsigned_int>(&this->_cursor);
  piVar3 = *ppiVar6;
  sVar2 = this->_index;
  p_Var4 = std::get<1ul,int_const*,unsigned_int,unsigned_int>(&this->_cursor);
  return piVar3 + (sVar2 - *p_Var4);
}

Assistant:

reference operator* () const
        {
        if (_index < std::get<1>(_cursor) || _index >= std::get<2>(_cursor))
          {
          _cursor = rrb_region_for(_impl, _index);
          }
        return std::get<0>(_cursor)[_index - std::get<1>(_cursor)];
        }